

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpPrepass::OnImportFunc
          (BinaryReaderObjdumpPrepass *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  undefined1 *puVar1;
  string_view name;
  string s;
  string s_1;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  char *local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  std::__cxx11::string::reserve((ulong)&local_70);
  std::__cxx11::string::append((char *)&local_70,(ulong)module_name._M_str);
  std::__cxx11::string::append((char *)&local_70,0x1338dc);
  puVar1 = local_70;
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  std::__cxx11::string::append((char *)&local_50,(ulong)puVar1);
  std::__cxx11::string::append((char *)&local_50,(ulong)field_name._M_str);
  name._M_str = local_50;
  name._M_len = local_48;
  ObjdumpNames::Set(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names,
                    func_index,name);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return (Result)Ok;
}

Assistant:

Result OnImportFunc(Index import_index,
                      std::string_view module_name,
                      std::string_view field_name,
                      Index func_index,
                      Index sig_index) override {
    SetFunctionName(func_index, module_name + "." + field_name);
    return Result::Ok;
  }